

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O2

void gnilk::Logger::AddSink
               (Ref *sink,string *name,
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *argv)

{
  element_type *peVar1;
  __shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  peVar1 = (sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_LogSink[3])(peVar1,argv);
  std::__shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>);
  AddSink((Ref *)&_Stack_28,name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

void Logger::AddSink(LogSink::Ref sink, const std::string &name, const std::vector<std::string_view> &argv) {
    sink->Initialize(argv);
    AddSink(sink,name);
}